

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

void ryg_dxt::PrepareOptTable4(sU8 *Table,sU8 *expand,sInt size)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  sInt min;
  ulong uVar8;
  sInt max;
  ulong uVar9;
  
  uVar5 = 0;
  if (0 < size) {
    uVar5 = (ulong)(uint)size;
  }
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    iVar6 = 0x100;
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; (uint)size != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = ((uint)expand[uVar8] + (uint)expand[uVar9] * 2) / 3 - (int)lVar7;
        iVar4 = -iVar3;
        if (0 < iVar3) {
          iVar4 = iVar3;
        }
        iVar3 = (uint)expand[uVar9] - (uint)expand[uVar8];
        bVar1 = (byte)iVar3;
        bVar2 = -bVar1;
        if (0 < iVar3) {
          bVar2 = bVar1;
        }
        iVar4 = (uint)(bVar2 >> 5) + iVar4;
        if (iVar4 < iVar6) {
          Table[lVar7 * 2] = (sU8)uVar9;
          Table[lVar7 * 2 + 1] = (sU8)uVar8;
          iVar6 = iVar4;
        }
      }
    }
  }
  return;
}

Assistant:

static void PrepareOptTable4(sU8* Table, const sU8* expand, sInt size) {
  for (sInt i = 0; i < 256; i++) {
    sInt bestErr = 256;

    for (sInt min = 0; min < size; min++) {
      for (sInt max = 0; max < size; max++) {
        sInt mine = expand[min];
        sInt maxe = expand[max];
        //sInt err = sAbs(maxe + Mul8Bit(mine-maxe,0x55) - i);
        sInt err = sAbs(((maxe * 2 + mine) / 3) - i);
        err += ((sAbs(maxe - mine) * 8) >> 8);  // approx. .03f

        if (err < bestErr) {
          Table[i * 2 + 0] = max;
          Table[i * 2 + 1] = min;
          bestErr = err;
        }
      }
    }
  }
}